

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktPipelineVertexUtil.cpp
# Opt level: O0

vector<vkt::pipeline::Vertex4Tex4,_std::allocator<vkt::pipeline::Vertex4Tex4>_> *
vkt::pipeline::createQuadMosaicCube(void)

{
  int iVar1;
  pointer pVVar2;
  vector<vkt::pipeline::Vertex4Tex4,_std::allocator<vkt::pipeline::Vertex4Tex4>_> *in_RDI;
  VecAccess<float,_4,_3> local_48;
  int local_30;
  int local_2c;
  int vertexNdx;
  int quadNdx;
  iterator vertexItr;
  vector<vkt::pipeline::Vertex4Tex4,_std::allocator<vkt::pipeline::Vertex4Tex4>_> *vertices;
  
  if ((createQuadMosaicCube()::texCoordsCube == '\0') &&
     (iVar1 = __cxa_guard_acquire(&createQuadMosaicCube()::texCoordsCube), iVar1 != 0)) {
    tcu::Vector<float,_3>::Vector(createQuadMosaicCube::texCoordsCube,-1.0,-1.0,-1.0);
    tcu::Vector<float,_3>::Vector(createQuadMosaicCube::texCoordsCube + 1,1.0,-1.0,-1.0);
    tcu::Vector<float,_3>::Vector(createQuadMosaicCube::texCoordsCube + 2,1.0,-1.0,1.0);
    tcu::Vector<float,_3>::Vector(createQuadMosaicCube::texCoordsCube + 3,-1.0,-1.0,1.0);
    tcu::Vector<float,_3>::Vector(createQuadMosaicCube::texCoordsCube + 4,-1.0,1.0,-1.0);
    tcu::Vector<float,_3>::Vector(createQuadMosaicCube::texCoordsCube + 5,1.0,1.0,-1.0);
    tcu::Vector<float,_3>::Vector(createQuadMosaicCube::texCoordsCube + 6,1.0,1.0,1.0);
    tcu::Vector<float,_3>::Vector(createQuadMosaicCube::texCoordsCube + 7,-1.0,1.0,1.0);
    __cxa_guard_release(&createQuadMosaicCube()::texCoordsCube);
  }
  vertexItr._M_current._3_1_ = 0;
  createQuadMosaic(in_RDI,2,3);
  _vertexNdx = std::vector<vkt::pipeline::Vertex4Tex4,_std::allocator<vkt::pipeline::Vertex4Tex4>_>
               ::begin(in_RDI);
  for (local_2c = 0; local_2c < 6; local_2c = local_2c + 1) {
    for (local_30 = 0; local_30 < 6; local_30 = local_30 + 1) {
      iVar1 = createQuadMosaicCube::texCoordCubeIndices[local_2c][local_30];
      pVVar2 = __gnu_cxx::
               __normal_iterator<vkt::pipeline::Vertex4Tex4_*,_std::vector<vkt::pipeline::Vertex4Tex4,_std::allocator<vkt::pipeline::Vertex4Tex4>_>_>
               ::operator->((__normal_iterator<vkt::pipeline::Vertex4Tex4_*,_std::vector<vkt::pipeline::Vertex4Tex4,_std::allocator<vkt::pipeline::Vertex4Tex4>_>_>
                             *)&vertexNdx);
      tcu::Vector<float,_4>::xyz(&local_48,&pVVar2->texCoord);
      tcu::VecAccess<float,_4,_3>::operator=(&local_48,createQuadMosaicCube::texCoordsCube + iVar1);
      __gnu_cxx::
      __normal_iterator<vkt::pipeline::Vertex4Tex4_*,_std::vector<vkt::pipeline::Vertex4Tex4,_std::allocator<vkt::pipeline::Vertex4Tex4>_>_>
      ::operator++((__normal_iterator<vkt::pipeline::Vertex4Tex4_*,_std::vector<vkt::pipeline::Vertex4Tex4,_std::allocator<vkt::pipeline::Vertex4Tex4>_>_>
                    *)&vertexNdx,0);
    }
  }
  return in_RDI;
}

Assistant:

std::vector<Vertex4Tex4> createQuadMosaicCube (void)
{
	using tcu::Vec3;

	static const Vec3 texCoordsCube[8] =
	{
		Vec3(-1.0f, -1.0f, -1.0f),	// 0: -X, -Y, -Z
		Vec3(1.0f, -1.0f, -1.0f),	// 1:  X, -Y, -Z
		Vec3(1.0f, -1.0f, 1.0f),	// 2:  X, -Y,  Z
		Vec3(-1.0f, -1.0f, 1.0f),	// 3: -X, -Y,  Z

		Vec3(-1.0f, 1.0f, -1.0f),	// 4: -X,  Y, -Z
		Vec3(1.0f, 1.0f, -1.0f),	// 5:  X,  Y, -Z
		Vec3(1.0f, 1.0f, 1.0f),		// 6:  X,  Y,  Z
		Vec3(-1.0f, 1.0f, 1.0f),	// 7: -X,  Y,  Z
	};

	static const int texCoordCubeIndices[6][6] =
	{
		{ 6, 5, 2, 2, 5, 1 },		// +X face
		{ 3, 0, 7, 7, 0, 4 },		// -X face
		{ 4, 5, 7, 7, 5, 6 },		// +Y face
		{ 3, 2, 0, 0, 2, 1 },		// -Y face
		{ 2, 3, 6, 6, 3, 7 },		// +Z face
		{ 0, 1, 4, 4, 1, 5 }		// -Z face
	};

	// Create 6 quads and set appropriate texture coordinates for cube mapping

	std::vector<Vertex4Tex4>			vertices	= createQuadMosaic(2, 3);
	std::vector<Vertex4Tex4>::iterator	vertexItr	= vertices.begin();

	for (int quadNdx = 0; quadNdx < 6; quadNdx++)
	{
		for (int vertexNdx = 0; vertexNdx < 6; vertexNdx++)
		{
			vertexItr->texCoord.xyz() = texCoordsCube[texCoordCubeIndices[quadNdx][vertexNdx]];
			vertexItr++;
		}
	}

	return vertices;
}